

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astMessageChainNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  _Bool _Var2;
  ulong uVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  ulong uVar7;
  anon_struct_24_3_13565e4c gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord_1;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  long local_200;
  sysbvm_tuple_t local_1f8;
  sysbvm_tuple_t sStack_1f0;
  sysbvm_tuple_t local_1e8;
  sysbvm_tuple_t sStack_1e0;
  sysbvm_tuple_t local_1d8;
  sysbvm_tuple_t sStack_1d0;
  sysbvm_tuple_t local_1c8;
  sysbvm_tuple_t sStack_1c0;
  sysbvm_tuple_t local_1b8;
  sysbvm_tuple_t local_1b0;
  sysbvm_tuple_t *local_1a8;
  long lStack_1a0;
  sysbvm_tuple_t local_198;
  ulong local_188;
  sysbvm_stackFrameRecord_t local_180;
  undefined8 local_170;
  sysbvm_stackFrameRecord_t local_168;
  undefined8 local_158;
  long *local_150;
  sysbvm_stackFrameRecord_t local_148;
  undefined8 local_138;
  anon_struct_136_2_7a050327_for_gcRoots *local_130;
  sysbvm_stackFrameRecord_t local_120;
  undefined8 local_110;
  sysbvm_stackFrameRecord_t local_108;
  undefined8 local_f8;
  sysbvm_tuple_t **local_f0;
  sysbvm_functionCallFrameStack_t local_e8;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_f0 = &local_1a8;
  local_1a8 = (sysbvm_tuple_t *)0x0;
  lStack_1a0 = 0;
  local_198 = 0;
  local_108.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_108.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_108._12_4_ = 0;
  local_f8 = 3;
  sysbvm_stackFrame_pushRecord(&local_108);
  local_120.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_120.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_110 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_120);
  sVar6 = *arguments;
  sVar5 = *(sysbvm_tuple_t *)(sVar6 + 0x28);
  if (sVar5 != 0) {
    local_1a8 = (sysbvm_tuple_t *)
                sysbvm_interpreter_evaluateASTWithEnvironment(context,sVar5,arguments[1]);
    sVar6 = *arguments;
  }
  uVar7 = *(ulong *)(sVar6 + 0x38);
  if (((uVar7 & 0xf) == 0 && uVar7 != 0) && (uVar1 = *(uint *)(uVar7 + 0xc), 7 < uVar1)) {
    local_188 = (ulong)(sVar5 != 0);
    uVar7 = 0;
    local_1b0 = sVar5;
    do {
      uVar3 = *(ulong *)(*arguments + 0x38);
      if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
        local_200 = *(long *)(uVar3 + 0x10 + uVar7 * 8);
      }
      else {
        local_200 = 0;
      }
      local_1b8 = 0;
      local_1c8 = 0;
      sStack_1c0 = 0;
      local_1d8 = 0;
      sStack_1d0 = 0;
      local_1e8 = 0;
      sStack_1e0 = 0;
      local_1f8 = 0;
      sStack_1f0 = 0;
      local_168.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_168.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
      local_168._12_4_ = 0;
      local_158 = 10;
      local_150 = &local_200;
      lStack_1a0 = local_200;
      sysbvm_stackFrame_pushRecord(&local_168);
      local_180.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_180.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
      local_170 = *(undefined8 *)(local_200 + 0x10);
      sysbvm_stackFrame_pushRecord(&local_180);
      uVar3 = *(ulong *)(local_200 + 0x30);
      sVar6 = 0;
      if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
        sVar6 = (sysbvm_tuple_t)(*(uint *)(uVar3 + 0xc) >> 3);
      }
      sStack_1f0 = sysbvm_interpreter_evaluateASTWithEnvironment
                             (context,*(sysbvm_tuple_t *)(local_200 + 0x28),arguments[1]);
      if (sVar5 == 0) {
        _Var2 = sysbvm_environment_lookSymbolRecursively(context,arguments[1],sStack_1f0,&local_1e8)
        ;
        if ((!_Var2) || (_Var2 = sysbvm_symbolBinding_isValue(context,local_1e8), !_Var2)) {
          sysbvm_error("Failed to find symbol for message send without receiver.");
        }
        if (((local_1e8 & 0xf) == 0 && local_1e8 != 0) && (0x57 < *(uint *)(local_1e8 + 0xc))) {
          sStack_1e0 = *(sysbvm_tuple_t *)(local_1e8 + 0x38);
        }
        else {
          sStack_1e0 = 0;
        }
LAB_0011b529:
        memset(&local_e8,0,0xb0);
        local_148.previous = (sysbvm_stackFrameRecord_s *)0x0;
        local_148.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
        local_148._12_4_ = 0;
        local_138 = 0x11;
        local_130 = &local_e8.gcRoots;
        sysbvm_stackFrame_pushRecord(&local_148);
        sysbvm_functionCallFrameStack_begin(context,&local_e8,sStack_1e0,local_188 + sVar6,0);
        if (sVar5 != 0) {
          sysbvm_functionCallFrameStack_push(&local_e8,(sysbvm_tuple_t)local_1a8);
        }
        if (sVar6 != 0) {
          sVar5 = 0;
          do {
            uVar3 = *(ulong *)(local_200 + 0x30);
            if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
              sStack_1d0 = *(sysbvm_tuple_t *)(uVar3 + 0x10 + sVar5 * 8);
            }
            else {
              sStack_1d0 = 0;
            }
            local_1c8 = sysbvm_interpreter_evaluateASTWithEnvironment
                                  (context,sStack_1d0,arguments[1]);
            sysbvm_functionCallFrameStack_push(&local_e8,local_1c8);
            sVar5 = sVar5 + 1;
          } while (sVar6 != sVar5);
        }
        sysbvm_stackFrame_popRecord(&local_148);
        local_1b8 = sysbvm_functionCallFrameStack_finish(context,&local_e8);
        sysbvm_stackFrame_popRecord(&local_180);
        sysbvm_stackFrame_popRecord(&local_168);
        sVar5 = local_1b0;
      }
      else {
        uVar3 = (ulong)local_1a8 & 0xf;
        if (uVar3 == 0 && local_1a8 != (sysbvm_tuple_t *)0x0) {
          local_1f8 = *local_1a8;
        }
        else if ((int)uVar3 == 0xf) {
          local_1f8 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_1a8 >> 4);
        }
        else {
          local_1f8 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar3);
        }
        sStack_1e0 = sysbvm_type_lookupSelector(context,local_1f8,sStack_1f0);
        if (sStack_1e0 != 0) goto LAB_0011b529;
        sStack_1e0 = sysbvm_type_lookupSelector
                               (context,local_1f8,(context->roots).doesNotUnderstandSelector);
        if (sStack_1e0 == 0) {
          sysbvm_error("Message not understood.");
        }
        local_1d8 = sysbvm_array_create(context,sVar6);
        if (sVar6 != 0) {
          sVar4 = 0;
          do {
            uVar3 = *(ulong *)(local_200 + 0x30);
            if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
              sStack_1d0 = *(sysbvm_tuple_t *)(uVar3 + 0x10 + sVar4 * 8);
            }
            else {
              sStack_1d0 = 0;
            }
            local_1c8 = sysbvm_interpreter_evaluateASTWithEnvironment
                                  (context,sStack_1d0,arguments[1]);
            if ((local_1c8 & 0xf) == 0 && local_1c8 != 0) {
              *(sysbvm_tuple_t *)(local_1c8 + 0x10 + sVar4 * 8) = local_1c8;
            }
            sVar4 = sVar4 + 1;
            sVar5 = local_1b0;
          } while (sVar6 != sVar4);
        }
        sStack_1c0 = sysbvm_message_create
                               (context,sStack_1f0,local_1d8,local_1f8,
                                *(sysbvm_tuple_t *)(local_200 + 0x10));
        local_e8.applicationFlags = (sysbvm_bitflags_t)local_1a8;
        local_e8._8_8_ = sStack_1c0;
        local_1b8 = sysbvm_function_apply(context,sStack_1e0,2,&local_e8.applicationFlags,1);
        sysbvm_stackFrame_popRecord(&local_180);
        sysbvm_stackFrame_popRecord(&local_168);
      }
      local_198 = local_1b8;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar1 >> 3);
  }
  sysbvm_stackFrame_popRecord(&local_120);
  sysbvm_stackFrame_popRecord(&local_108);
  return local_198;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageChainNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMessageChainNode_t **chainNode = (sysbvm_astMessageChainNode_t**)node;

    struct {
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t chainedMessage;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*chainNode)->super.sourcePosition);

    bool hasReceiver = false;
    if((*chainNode)->receiver)
    {
        gcFrame.receiver = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*chainNode)->receiver, *environment);
        hasReceiver = true;
    }

    size_t chainedMessageCount = sysbvm_array_getSize((*chainNode)->messages);
    for(size_t i = 0; i < chainedMessageCount; ++i)
    {
        gcFrame.chainedMessage = sysbvm_array_at((*chainNode)->messages, i);
        gcFrame.result = sysbvm_astMessageChainMessageNode_evaluate(context, gcFrame.chainedMessage, hasReceiver, &gcFrame.receiver, environment);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}